

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgentQMDP.cpp
# Opt level: O0

Index __thiscall AgentQMDP::Act(AgentQMDP *this,Index joI)

{
  size_t sVar1;
  uint uVar2;
  PlanningUnitDecPOMDPDiscrete *this_00;
  size_t sVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar4;
  reference pdVar5;
  reference pvVar6;
  AgentDecPOMDPDiscrete *in_RDI;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> aIs;
  uint s;
  size_t a;
  double v;
  double q;
  Index aI;
  Index jaInew;
  Index in_stack_00000148;
  Index in_stack_0000014c;
  MultiAgentDecisionProcessDiscreteInterface *in_stack_00000150;
  JointBeliefSparse *in_stack_00000158;
  undefined4 in_stack_ffffffffffffff68;
  Index in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  Index IVar10;
  Index in_stack_ffffffffffffff74;
  PlanningUnitMADPDiscrete *in_stack_ffffffffffffff78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff80;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  uint local_34;
  size_t local_30;
  double local_28;
  double local_20;
  Index local_14;
  undefined4 local_10;
  
  if (in_RDI[3].super_SimulationAgent._vptr_SimulationAgent != (_func_int **)0x0) {
    this_00 = AgentDecPOMDPDiscrete::GetPU(in_RDI);
    PlanningUnitDecPOMDPDiscrete::GetDPOMDPD(this_00);
    JointBeliefSparse::Update
              (in_stack_00000158,in_stack_00000150,in_stack_0000014c,in_stack_00000148);
  }
  local_10 = 0x7fffffff;
  local_28 = -1.79769313486232e+308;
  local_30 = 0;
  while( true ) {
    sVar1 = local_30;
    AgentDecPOMDPDiscrete::GetPU(in_RDI);
    sVar3 = PlanningUnitMADPDiscrete::GetNrJointActions((PlanningUnitMADPDiscrete *)0x8fba4f);
    if (sVar1 == sVar3) break;
    local_20 = 0.0;
    local_34 = 0;
    while( true ) {
      in_stack_ffffffffffffff80 =
           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)local_34;
      AgentDecPOMDPDiscrete::GetPU(in_RDI);
      pvVar4 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               PlanningUnitMADPDiscrete::GetNrStates
                         ((PlanningUnitMADPDiscrete *)
                          CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      if (in_stack_ffffffffffffff80 == pvVar4) break;
      in_stack_ffffffffffffff78 =
           (PlanningUnitMADPDiscrete *)
           BeliefSparse::Get((BeliefSparse *)
                             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                             in_stack_ffffffffffffff6c);
      pdVar5 = boost::numeric::ublas::
               matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
               ::operator()((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                             *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                            CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),0x8fbadd);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = in_stack_ffffffffffffff78;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = *pdVar5;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_20;
      auVar7 = vfmadd213sd_fma(auVar7,auVar8,auVar9);
      local_20 = auVar7._0_8_;
      local_34 = local_34 + 1;
    }
    if (local_28 < local_20) {
      local_28 = local_20;
      local_10 = (undefined4)local_30;
    }
    local_30 = local_30 + 1;
  }
  AgentDecPOMDPDiscrete::GetPU(in_RDI);
  PlanningUnitMADPDiscrete::JointToIndividualActionIndices
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
  uVar2 = (*(in_RDI->super_SimulationAgent)._vptr_SimulationAgent[2])();
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&local_50,(ulong)uVar2);
  IVar10 = *pvVar6;
  *(undefined4 *)&in_RDI[7].super_SimulationAgent._vptr_SimulationAgent = local_10;
  in_RDI[3].super_SimulationAgent._vptr_SimulationAgent =
       (_func_int **)((long)in_RDI[3].super_SimulationAgent._vptr_SimulationAgent + 1);
  local_14 = IVar10;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_ffffffffffffff80);
  return IVar10;
}

Assistant:

Index AgentQMDP::Act(Index joI)
{
    if(_m_t>0)
        _m_jb.Update(*GetPU()->GetDPOMDPD(),_m_prevJaI,joI);

    Index jaInew=INT_MAX,aI;
    double q,v=-DBL_MAX;
    for(size_t a=0;a!=GetPU()->GetNrJointActions();++a)
    {
        q=0;
        for(unsigned s=0;s!=GetPU()->GetNrStates();++s)
            q+=_m_jb.Get(s)*_m_Q(s,a);

//        if(q>(v+PROB_PRECISION))
        if(q>v)
        {
            v=q;
            jaInew=a;
        }
    }

    vector<Index> aIs=GetPU()->JointToIndividualActionIndices(jaInew);
    aI=aIs[GetIndex()];

    _m_prevJaI=jaInew;
    _m_t++;

#if DEBUG_AgentQMDP
    cout << GetIndex() << ": ";
    _m_jb.Print();
    cout << " v " << v << " ja " << jaInew << " aI " << aI << endl;
#endif

    return(aI);
}